

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::CommandLineInterface::MemoryOutputStream::UpdateMetadata
          (MemoryOutputStream *this,string *insertion_content,size_t insertion_offset,
          size_t insertion_length,size_t indent_length)

{
  GeneratorContextImpl *pGVar1;
  bool bVar2;
  bool bVar3;
  int32_t iVar4;
  ostream *poVar5;
  pointer ppVar6;
  RepeatedPtrField<google::protobuf::GeneratedCodeInfo_Annotation> *pRVar7;
  reference this_00;
  GeneratedCodeInfo_Annotation *this_01;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>
  pVar8;
  bool local_1c9;
  Annotation *annotation;
  GeneratedCodeInfo_Annotation *source_annotation;
  const_iterator __end2;
  const_iterator __begin2;
  RepeatedPtrField<google::protobuf::GeneratedCodeInfo_Annotation> *__range2;
  size_t to_add;
  undefined1 local_170 [7];
  bool crossed_offset;
  GeneratedCodeInfo new_metadata;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_110;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d0;
  undefined1 local_c8;
  undefined4 local_bc;
  _Self local_b8;
  ConstStringParam local_b0;
  string *encoded_data;
  undefined1 local_a0 [7];
  bool is_text_format;
  GeneratedCodeInfo metadata;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  _Self local_38;
  iterator it;
  size_t indent_length_local;
  size_t insertion_length_local;
  size_t insertion_offset_local;
  string *insertion_content_local;
  MemoryOutputStream *this_local;
  
  pGVar1 = this->directory_;
  it._M_node = (_Base_ptr)indent_length;
  std::operator+(&local_58,&this->filename_,".pb.meta");
  local_38._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&pGVar1->files_,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  metadata._40_8_ =
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(&this->directory_->files_);
  bVar2 = std::operator==(&local_38,(_Self *)&metadata._cached_size_);
  local_1c9 = false;
  if (bVar2) {
    pRVar7 = GeneratedCodeInfo::annotation(&this->info_to_insert_);
    local_1c9 = RepeatedPtrField<google::protobuf::GeneratedCodeInfo_Annotation>::empty(pRVar7);
  }
  if (local_1c9 != false) {
    return;
  }
  GeneratedCodeInfo::GeneratedCodeInfo((GeneratedCodeInfo *)local_a0);
  encoded_data._7_1_ = 0;
  local_b0 = (ConstStringParam)0x0;
  local_b8._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(&this->directory_->files_);
  bVar2 = std::operator!=(&local_38,&local_b8);
  if (bVar2) {
    ppVar6 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_38);
    local_b0 = &ppVar6->second;
    bVar2 = MessageLite::ParseFromString((MessageLite *)local_a0,local_b0);
    if (!bVar2) {
      bVar2 = TextFormat::ParseFromString(local_b0,(Message *)local_a0);
      if (!bVar2) {
        poVar5 = std::operator<<((ostream *)&std::cerr,(string *)&this->filename_);
        poVar5 = std::operator<<(poVar5,".pb.meta: Could not parse metadata as wire or text format."
                                );
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        local_bc = 1;
        goto LAB_004364c2;
      }
      encoded_data._7_1_ = 1;
    }
  }
  else {
    pGVar1 = this->directory_;
    std::operator+(&local_130,&this->filename_,".pb.meta");
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_(&)[1],_true>
              (&local_110,&local_130,(char (*) [1])0x76a5a1);
    pVar8 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::insert(&pGVar1->files_,&local_110);
    new_metadata._40_8_ = pVar8.first._M_node;
    local_c8 = pVar8.second;
    local_d0._M_node = (_Base_ptr)new_metadata._40_8_;
    ppVar6 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_d0);
    local_b0 = &ppVar6->second;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&local_110);
    std::__cxx11::string::~string((string *)&local_130);
  }
  GeneratedCodeInfo::GeneratedCodeInfo((GeneratedCodeInfo *)local_170);
  bVar2 = false;
  __range2 = (RepeatedPtrField<google::protobuf::GeneratedCodeInfo_Annotation> *)0x0;
  pRVar7 = GeneratedCodeInfo::annotation((GeneratedCodeInfo *)local_a0);
  __end2 = RepeatedPtrField<google::protobuf::GeneratedCodeInfo_Annotation>::begin(pRVar7);
  source_annotation =
       (GeneratedCodeInfo_Annotation *)
       RepeatedPtrField<google::protobuf::GeneratedCodeInfo_Annotation>::end(pRVar7);
  while (bVar3 = internal::RepeatedPtrIterator<const_google::protobuf::GeneratedCodeInfo_Annotation>
                 ::operator!=(&__end2,(iterator *)&source_annotation), bVar3) {
    this_00 = internal::RepeatedPtrIterator<const_google::protobuf::GeneratedCodeInfo_Annotation>::
              operator*(&__end2);
    iVar4 = GeneratedCodeInfo_Annotation::begin(this_00);
    if ((insertion_offset <= (ulong)(long)iVar4) && (!bVar2)) {
      bVar2 = true;
      InsertShiftedInfo(this,insertion_content,insertion_offset,(size_t)it._M_node,
                        (GeneratedCodeInfo *)local_170);
      __range2 = (RepeatedPtrField<google::protobuf::GeneratedCodeInfo_Annotation> *)
                 ((long)&(__range2->super_RepeatedPtrFieldBase).arena_ + insertion_length);
    }
    this_01 = GeneratedCodeInfo::add_annotation((GeneratedCodeInfo *)local_170);
    GeneratedCodeInfo_Annotation::operator=(this_01,this_00);
    iVar4 = GeneratedCodeInfo_Annotation::begin(this_01);
    GeneratedCodeInfo_Annotation::set_begin(this_01,iVar4 + (int)__range2);
    iVar4 = GeneratedCodeInfo_Annotation::end(this_01);
    GeneratedCodeInfo_Annotation::set_end(this_01,iVar4 + (int)__range2);
    internal::RepeatedPtrIterator<const_google::protobuf::GeneratedCodeInfo_Annotation>::operator++
              (&__end2);
  }
  if (!bVar2) {
    InsertShiftedInfo(this,insertion_content,insertion_offset,(size_t)it._M_node,
                      (GeneratedCodeInfo *)local_170);
  }
  if ((encoded_data._7_1_ & 1) == 0) {
    MessageLite::SerializeToString((MessageLite *)local_170,local_b0);
  }
  else {
    TextFormat::PrintToString((Message *)local_170,local_b0);
  }
  GeneratedCodeInfo::~GeneratedCodeInfo((GeneratedCodeInfo *)local_170);
  local_bc = 0;
LAB_004364c2:
  GeneratedCodeInfo::~GeneratedCodeInfo((GeneratedCodeInfo *)local_a0);
  return;
}

Assistant:

void CommandLineInterface::MemoryOutputStream::UpdateMetadata(
    const std::string& insertion_content, size_t insertion_offset,
    size_t insertion_length, size_t indent_length) {
  auto it = directory_->files_.find(filename_ + ".pb.meta");
  if (it == directory_->files_.end() && info_to_insert_.annotation().empty()) {
    // No metadata was recorded for this file.
    return;
  }
  GeneratedCodeInfo metadata;
  bool is_text_format = false;
  std::string* encoded_data = nullptr;
  if (it != directory_->files_.end()) {
    encoded_data = &it->second;
    // Try to decode a GeneratedCodeInfo proto from the .pb.meta file. It may be
    // in wire or text format. Keep the same format when the data is written out
    // later.
    if (!metadata.ParseFromString(*encoded_data)) {
      if (!TextFormat::ParseFromString(*encoded_data, &metadata)) {
        // The metadata is invalid.
        std::cerr
            << filename_
            << ".pb.meta: Could not parse metadata as wire or text format."
            << std::endl;
        return;
      }
      // Generators that use the public plugin interface emit text-format
      // metadata (because in the public plugin protocol, file content must be
      // UTF8-encoded strings).
      is_text_format = true;
    }
  } else {
    // Create a new file to store the new metadata in info_to_insert_.
    encoded_data =
        &directory_->files_.insert({filename_ + ".pb.meta", ""}).first->second;
  }
  GeneratedCodeInfo new_metadata;
  bool crossed_offset = false;
  size_t to_add = 0;
  for (const auto& source_annotation : metadata.annotation()) {
    // The first time an annotation at or after the insertion point is found,
    // insert the new metadata from info_to_insert_. Shift all annotations
    // after the new metadata by the length of the text that was inserted
    // (including any additional indent length).
    if (source_annotation.begin() >= insertion_offset && !crossed_offset) {
      crossed_offset = true;
      InsertShiftedInfo(insertion_content, insertion_offset, indent_length,
                        new_metadata);
      to_add += insertion_length;
    }
    GeneratedCodeInfo::Annotation* annotation = new_metadata.add_annotation();
    *annotation = source_annotation;
    annotation->set_begin(annotation->begin() + to_add);
    annotation->set_end(annotation->end() + to_add);
  }
  // If there were never any annotations at or after the insertion point,
  // make sure to still insert the new metadata from info_to_insert_.
  if (!crossed_offset) {
    InsertShiftedInfo(insertion_content, insertion_offset, indent_length,
                      new_metadata);
  }
  if (is_text_format) {
    TextFormat::PrintToString(new_metadata, encoded_data);
  } else {
    new_metadata.SerializeToString(encoded_data);
  }
}